

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O0

void __thiscall MainLoop::p_Update(MainLoop *this)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  reference pfVar3;
  rep_conflict __args;
  function<void_(float)> *odDU;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_> *__range2_1;
  function<void_()> *odU;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  function<void_(float)> *oDU;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_> *__range1_1;
  type tStack_48;
  float elapsedTime;
  rep_conflict local_3c;
  rep local_38;
  reference local_30;
  function<void_()> *oU;
  iterator __end1;
  iterator __begin1;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range1;
  MainLoop *this_local;
  
  __end1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                     (&onUpdate);
  oU = (function<void_()> *)
       std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end(&onUpdate)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                                *)&oU);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
               ::operator*(&__end1);
    std::function<void_()>::operator()(local_30);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&__end1);
  }
  if (p_Update()::lastTime == '\0') {
    iVar2 = __cxa_guard_acquire(&p_Update()::lastTime);
    if (iVar2 != 0) {
      p_Update::lastTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&p_Update()::lastTime);
    }
  }
  p_Update::currTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_38 = (rep)p_Update::currTime.__d.__r;
  tStack_48 = std::chrono::operator-(&p_Update::currTime,&p_Update::lastTime);
  std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<float,std::ratio<1l,1l>> *)&local_3c,&stack0xffffffffffffffb8);
  p_Update::deltaTime.__r = local_3c;
  p_Update::lastTime = p_Update::currTime;
  __args = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&p_Update::deltaTime);
  __end1_1 = std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
             ::begin(&onDeltaUpdate);
  oDU = (function<void_(float)> *)
        std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>::end
                  (&onDeltaUpdate);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
                        *)&oDU);
    if (!bVar1) break;
    pfVar3 = __gnu_cxx::
             __normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
             ::operator*(&__end1_1);
    std::function<void_(float)>::operator()(pfVar3,__args);
    __gnu_cxx::
    __normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
    ::operator++(&__end1_1);
  }
  p_Update::delayedUpdateTimeoutSoFar = __args + p_Update::delayedUpdateTimeoutSoFar;
  if (this->p_delay_length <= p_Update::delayedUpdateTimeoutSoFar &&
      p_Update::delayedUpdateTimeoutSoFar != this->p_delay_length) {
    __end2 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                       (&onDelayedUpdate);
    odU = (function<void_()> *)
          std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                    (&onDelayedUpdate);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                                  *)&odU);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                ::operator*(&__end2);
      std::function<void_()>::operator()(this_00);
      __gnu_cxx::
      __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>::
               begin(&onDelayedDeltaUpdate);
    odDU = (function<void_(float)> *)
           std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>::
           end(&onDelayedDeltaUpdate);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
                          *)&odDU);
      if (!bVar1) break;
      pfVar3 = __gnu_cxx::
               __normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
               ::operator*(&__end2_1);
      std::function<void_(float)>::operator()(pfVar3,p_Update::delayedUpdateTimeoutSoFar);
      __gnu_cxx::
      __normal_iterator<std::function<void_(float)>_*,_std::vector<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>_>
      ::operator++(&__end2_1);
    }
    p_Update::delayedUpdateTimeoutSoFar = 0.0;
  }
  return;
}

Assistant:

void MainLoop::p_Update()
{

	for (const auto &oU : onUpdate)
	{
		oU();
	}

	static std::chrono::system_clock::time_point currTime;
	static std::chrono::system_clock::time_point lastTime = std::chrono::system_clock::now();
	static std::chrono::duration<float> deltaTime;

	currTime = std::chrono::system_clock::now();
	deltaTime = currTime - lastTime;
	lastTime = currTime;

	float elapsedTime = deltaTime.count();
	for (const auto &oDU : onDeltaUpdate)
	{
		oDU(elapsedTime);
	}

	static float delayedUpdateTimeoutSoFar = 0.f;
	delayedUpdateTimeoutSoFar += elapsedTime;
	if (delayedUpdateTimeoutSoFar > p_delay_length)
	{
		for (auto &odU : onDelayedUpdate)
		{
			odU();
		}
		for (auto &odDU : onDelayedDeltaUpdate)
		{
			odDU(delayedUpdateTimeoutSoFar); //combines all missed delta time since last update
		}
		delayedUpdateTimeoutSoFar = 0.f; // reset
	}
}